

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_avx2.c
# Opt level: O1

parasail_profile_t *
parasail_profile_create_avx_256_8(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  undefined8 *puVar1;
  uint uVar2;
  void *pvVar3;
  parasail_profile_t *ppVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  byte *pbVar13;
  uint uVar14;
  __m256i_8_t t;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  int iVar15;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_create_avx_256_8_cold_2();
  }
  else if (s1 == (char *)0x0 && matrix->type == 0) {
    parasail_profile_create_avx_256_8_cold_1();
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    uVar2 = matrix->size;
    iVar15 = _s1Len + 0x3e;
    if (-1 < _s1Len + 0x1f) {
      iVar15 = _s1Len + 0x1f;
    }
    uVar14 = iVar15 >> 5;
    pvVar3 = parasail_memalign(0x20,(long)(int)(uVar14 * uVar2) << 5);
    if ((pvVar3 != (void *)0x0) &&
       (ppVar4 = parasail_profile_new(s1,_s1Len,matrix), ppVar4 != (parasail_profile_t *)0x0)) {
      if (0 < (int)uVar2) {
        uVar5 = 1;
        if (1 < (int)uVar14) {
          uVar5 = (ulong)uVar14;
        }
        uVar6 = 0;
        lVar9 = 0;
        do {
          if (0 < _s1Len) {
            lVar9 = (long)(int)lVar9;
            uVar10 = 0;
            do {
              iVar15 = matrix->type;
              lVar12 = 0;
              uVar11 = uVar10;
              do {
                if (iVar15 == 0) {
                  if ((int)uVar11 < _s1Len) {
                    pbVar13 = (byte *)(s1 + uVar11);
                    uVar8 = uVar6;
                    goto LAB_0077ae8d;
                  }
LAB_0077aeae:
                  uVar7 = 0;
                }
                else {
                  if (_s1Len <= (int)uVar11) goto LAB_0077aeae;
                  pbVar13 = (byte *)(matrix->alphabet + uVar6);
                  uVar8 = uVar11;
LAB_0077ae8d:
                  uVar7 = (undefined1)
                          matrix->matrix
                          [(long)(int)((int)uVar8 * uVar2) + (long)matrix->mapper[*pbVar13]];
                }
                *(undefined1 *)((long)&local_80 + lVar12) = uVar7;
                uVar11 = uVar11 + uVar14;
                lVar12 = lVar12 + 1;
              } while (lVar12 != 0x20);
              puVar1 = (undefined8 *)((long)pvVar3 + lVar9 * 0x20);
              *puVar1 = local_80;
              puVar1[1] = uStack_78;
              puVar1[2] = uStack_70;
              puVar1[3] = uStack_68;
              lVar9 = lVar9 + 1;
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar5);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar2);
      }
      (ppVar4->profile8).score = pvVar3;
      ppVar4->free = parasail_free___m256i;
      return ppVar4;
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_avx_256_8(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0; /* number of amino acids in table */
    const int32_t segWidth = 32; /* number of values in vector unit */
    int32_t segLen = 0;
    __m256i* restrict vProfile = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is ignored for pssm, required for square */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
    }

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size;
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m256i(32, n * segLen);
    if (!vProfile) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m256i_8_t t;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                j += segLen;
            }
            _mm256_store_si256(&vProfile[index], t.m);
            ++index;
        }
    }

    profile->profile8.score = vProfile;
    profile->free = &parasail_free___m256i;
    return profile;
}